

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

int * Ssw_SmlCheckOutputSavePattern(Ssw_Sml_t *p,Aig_Obj_t *pObjPo)

{
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar10 = (ulong)p->nWordsTotal;
  bVar12 = 0 < (long)uVar10;
  if (0 < (long)uVar10) {
    lVar5 = (long)(*(int *)(((ulong)pObjPo->pFanin0 & 0xfffffffffffffffe) + 0x24) * p->nWordsTotal);
    piVar4 = (int *)((long)&p[1].pAig + lVar5 * 4);
    if (*piVar4 == 0) {
      uVar8 = 0;
      do {
        if (uVar10 - 1 == uVar8) goto LAB_006a88b5;
        uVar11 = uVar8 + 1;
        lVar9 = uVar8 * 4;
        uVar8 = uVar11;
      } while (*(int *)((long)&p[1].pAig + lVar9 + lVar5 * 4 + 4) == 0);
      bVar12 = uVar11 < uVar10;
    }
    else {
      uVar11 = 0;
    }
    if (bVar12) {
      uVar6 = 0;
      do {
        if (((uint)piVar4[uVar11] >> (uVar6 & 0x1f) & 1) != 0) {
          pAVar1 = p->pAig;
          lVar9 = (long)pAVar1->nObjs[2];
          piVar4 = (int *)malloc(lVar9 * 4 + 4);
          pVVar2 = pAVar1->vCis;
          lVar5 = (long)pVVar2->nSize;
          if (0 < lVar5) {
            ppvVar3 = pVVar2->pArray;
            lVar7 = 0;
            do {
              piVar4[lVar7] =
                   (uint)((*(uint *)((long)&p[1].pAig +
                                    (long)*(int *)((long)ppvVar3[lVar7] + 0x24) * uVar10 * 4 +
                                    uVar11 * 4) >> (uVar6 & 0x1f) & 1) != 0);
              lVar7 = lVar7 + 1;
            } while (lVar5 != lVar7);
          }
          piVar4[lVar9] = pObjPo->Id;
          return piVar4;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0x20);
      __assert_fail("k < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                    ,0x1c8,"int *Ssw_SmlCheckOutputSavePattern(Ssw_Sml_t *, Aig_Obj_t *)");
    }
  }
LAB_006a88b5:
  __assert_fail("i < p->nWordsTotal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                ,0x1c3,"int *Ssw_SmlCheckOutputSavePattern(Ssw_Sml_t *, Aig_Obj_t *)");
}

Assistant:

int * Ssw_SmlCheckOutputSavePattern( Ssw_Sml_t * p, Aig_Obj_t * pObjPo )
{
    Aig_Obj_t * pFanin, * pObjPi;
    unsigned * pSims;
    int i, k, BestPat, * pModel;
    // find the word of the pattern
    pFanin = Aig_ObjFanin0(pObjPo);
    pSims = Ssw_ObjSim(p, pFanin->Id);
    for ( i = 0; i < p->nWordsTotal; i++ )
        if ( pSims[i] )
            break;
    assert( i < p->nWordsTotal );
    // find the bit of the pattern
    for ( k = 0; k < 32; k++ )
        if ( pSims[i] & (1 << k) )
            break;
    assert( k < 32 );
    // determine the best pattern
    BestPat = i * 32 + k;
    // fill in the counter-example data
    pModel = ABC_ALLOC( int, Aig_ManCiNum(p->pAig)+1 );
    Aig_ManForEachCi( p->pAig, pObjPi, i )
    {
        pModel[i] = Abc_InfoHasBit(Ssw_ObjSim(p, pObjPi->Id), BestPat);
//        Abc_Print( 1, "%d", pModel[i] );
    }
    pModel[Aig_ManCiNum(p->pAig)] = pObjPo->Id;
//    Abc_Print( 1, "\n" );
    return pModel;
}